

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_get_cmap_info(FT_CharMap charmap,TT_CMapInfo *cmap_info)

{
  FT_Generic_Finalizer UNRECOVERED_JUMPTABLE;
  FT_Error FVar1;
  
  UNRECOVERED_JUMPTABLE = ((charmap[1].face)->generic).finalizer;
  if (UNRECOVERED_JUMPTABLE != (FT_Generic_Finalizer)0x0) {
    FVar1 = (*UNRECOVERED_JUMPTABLE)(charmap);
    return FVar1;
  }
  return 0x96;
}

Assistant:

FT_LOCAL( FT_Error )
  tt_get_cmap_info( FT_CharMap    charmap,
                    TT_CMapInfo  *cmap_info )
  {
    FT_CMap        cmap  = (FT_CMap)charmap;
    TT_CMap_Class  clazz = (TT_CMap_Class)cmap->clazz;

    if ( clazz->get_cmap_info )
      return clazz->get_cmap_info( charmap, cmap_info );
    else
      return FT_THROW( Invalid_CharMap_Format );
  }